

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

void qSetMessagePattern(QString *pattern)

{
  QBasicMutex copy;
  Type *pTVar1;
  QBasicMutex *this;
  
  if ((AtomicType)QMessagePattern::mutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    QMessagePattern::mutex.d_ptr._q_value._M_b._M_p =
         (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
    this = (QBasicMutex *)pattern;
  }
  else {
    this = &QMessagePattern::mutex;
    QBasicMutex::lockInternal(&QMessagePattern::mutex);
  }
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
                       *)this);
  if (pTVar1->fromEnvironment == false) {
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
             operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
                         *)this);
    QMessagePattern::setPattern(pTVar1,pattern);
  }
  copy.d_ptr._q_value._M_b._M_p = QMessagePattern::mutex.d_ptr._q_value._M_b._M_p;
  LOCK();
  QMessagePattern::mutex.d_ptr._q_value._M_b._M_p =
       (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
  UNLOCK();
  if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
    QBasicMutex::unlockInternalFutex(&QMessagePattern::mutex,(void *)copy.d_ptr._q_value._M_b._M_p);
    return;
  }
  return;
}

Assistant:

void qSetMessagePattern(const QString &pattern)
{
    const auto locker = qt_scoped_lock(QMessagePattern::mutex);

    if (!qMessagePattern()->fromEnvironment)
        qMessagePattern()->setPattern(pattern);
}